

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O3

CommandQueueVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::CommandQueueVkImpl,Diligent::IMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::CommandQueueVkImpl,Diligent::IMemoryAllocator> *this,
          shared_ptr<VulkanUtilities::VulkanLogicalDevice> *CtorArgs,
          IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *CtorArgs_1,uint *CtorArgs_2
          ,uint *CtorArgs_3,ImmediateContextCreateInfo *CtorArgs_4)

{
  undefined8 *puVar1;
  RefCountersImpl *pRefCounters;
  CommandQueueVkImpl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  RefCountersImpl *local_70;
  shared_ptr<VulkanUtilities::VulkanLogicalDevice> local_50;
  shared_ptr<VulkanUtilities::VulkanLogicalDevice> local_40;
  
  if (*(long **)(this + 8) == (long *)0x0) {
    pRefCounters = (RefCountersImpl *)operator_new(0x30);
    (pRefCounters->super_IReferenceCounters)._vptr_IReferenceCounters =
         (_func_int **)&PTR_AddStrongRef_0091b8e8;
    (pRefCounters->m_ObjectState)._M_i = NotInitialized;
    pRefCounters->m_ObjectWrapperBuffer[0] = 0;
    pRefCounters->m_ObjectWrapperBuffer[1] = 0;
    pRefCounters->m_ObjectWrapperBuffer[2] = 0;
    pRefCounters->m_NumStrongReferences = (__atomic_base<int>)0x0;
    pRefCounters->m_NumWeakReferences = (__atomic_base<int>)0x0;
    (pRefCounters->m_Lock).m_IsLocked._M_base._M_i = false;
    local_70 = pRefCounters;
  }
  else {
    pRefCounters = (RefCountersImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
    local_70 = (RefCountersImpl *)0x0;
  }
  puVar1 = *(undefined8 **)this;
  if (puVar1 == (undefined8 *)0x0) {
    this_00 = (CommandQueueVkImpl *)malloc(0x1d8);
    local_50.super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (CtorArgs->
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_50.super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (CtorArgs->
         super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_50.
        super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.
         super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.
         super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    CommandQueueVkImpl::CommandQueueVkImpl
              (this_00,&pRefCounters->super_IReferenceCounters,&local_50,
               (SoftwareQueueIndex)CtorArgs_1->m_Value,*CtorArgs_2,*CtorArgs_3,CtorArgs_4);
    this_01._M_pi =
         local_50.
         super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  else {
    this_00 = (CommandQueueVkImpl *)
              (**(code **)*puVar1)
                        (puVar1,0x1d8,*(undefined8 *)(this + 0x10),*(undefined8 *)(this + 0x18),
                         *(undefined4 *)(this + 0x20));
    local_40.super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (CtorArgs->
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_40.super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (CtorArgs->
         super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_40.
        super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.
         super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_40.
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.
         super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_40.
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    CommandQueueVkImpl::CommandQueueVkImpl
              (this_00,&pRefCounters->super_IReferenceCounters,&local_40,
               (SoftwareQueueIndex)CtorArgs_1->m_Value,*CtorArgs_2,*CtorArgs_3,CtorArgs_4);
    this_01._M_pi =
         local_40.
         super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  if (local_70 != (RefCountersImpl *)0x0) {
    RefCountersImpl::Attach<Diligent::CommandQueueVkImpl,Diligent::IMemoryAllocator>
              (local_70,this_00,*(IMemoryAllocator **)this);
  }
  return this_00;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }